

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall mjs::parser::check_string_literal(parser *this,source_extend *extend)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  wchar_t *in_R9;
  bool bVar4;
  bool bVar5;
  wstring_view message;
  wostringstream _oss;
  size_t local_1a8;
  source_extend *local_1a0;
  wostringstream local_188 [376];
  
  uVar2 = extend->end - extend->start;
  bVar4 = uVar2 != 0;
  if (bVar4) {
    lVar3 = 0;
    in_R9 = (wchar_t *)0x0;
    do {
      uVar1 = *(uint *)((long)(((extend->file).
                                super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->text_)._M_dataplus._M_p + lVar3 + (ulong)extend->start * 4);
      if (in_R9 == (wchar_t *)0x0) {
        if (uVar1 == 0x5c) {
          in_R9 = (wchar_t *)0x1;
        }
        bVar5 = true;
      }
      else {
        bVar5 = (uVar1 & 0xfff8) != 0x30;
        if (bVar5) {
          in_R9 = (wchar_t *)0x0;
        }
      }
      if (!bVar5) break;
      lVar3 = lVar3 + 4;
      bVar4 = (ulong)uVar2 << 2 != lVar3;
    } while (bVar4);
  }
  if (bVar4) {
    std::__cxx11::wostringstream::wostringstream(local_188);
    std::operator<<((wostream *)local_188,"Octal escape sequences may not be used in strict mode");
    std::__cxx11::wstringbuf::str();
    message._M_str = in_R9;
    message._M_len = local_1a8;
    syntax_error((parser *)"check_string_literal",(char *)0x1a1,(int)extend,local_1a0,message);
  }
  return;
}

Assistant:

void check_string_literal(const source_extend& extend) {
        if (has_octal_escape_sequence(extend.source_view())) {
            SYNTAX_ERROR_AT("Octal escape sequences may not be used in strict mode", extend);
        }
    }